

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS
ref_recon_kexact_rs(REF_GLOB center_global,REF_CLOUD ref_cloud,REF_DBL *rn,REF_DBL *sn,
                   REF_DBL *hessian)

{
  REF_GLOB *pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_DBL *pRVar4;
  REF_DBL *r;
  REF_DBL *pRVar5;
  int iVar6;
  undefined8 uVar7;
  REF_DBL *pRVar8;
  long lVar9;
  size_t __size;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  int m;
  double *pdVar13;
  REF_GLOB RVar14;
  char *pcVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  REF_DBL xyzs [4];
  REF_DBL ab [12];
  uint local_104;
  ulong local_100;
  REF_DBL *local_f8;
  ulong local_f0;
  REF_DBL *local_e8;
  long local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8 [4];
  REF_DBL local_98 [9];
  double dStack_50;
  REF_DBL local_48;
  REF_DBL RStack_40;
  
  uVar2 = ref_cloud_item(ref_cloud,center_global,(REF_INT *)&local_104);
  if (uVar2 == 0) {
    lVar9 = (long)ref_cloud->naux;
    local_e8 = hessian;
    if (0 < lVar9) {
      memcpy(&local_d8,ref_cloud->aux + (int)local_104 * lVar9,lVar9 * 8);
    }
    uVar2 = ref_cloud->n;
    uVar16 = (ulong)(int)uVar2;
    if ((long)uVar16 < 4) {
      return 4;
    }
    local_f0 = (ulong)(uVar2 - 1);
    __size = (ulong)((uVar2 - 1) * 3) << 3;
    local_e0 = lVar9;
    pRVar4 = (REF_DBL *)malloc(__size);
    if (pRVar4 == (REF_DBL *)0x0) {
      pcVar15 = "malloc a of REF_DBL NULL";
      uVar7 = 0x619;
    }
    else {
      local_f8 = pRVar4;
      pRVar4 = (REF_DBL *)malloc(__size);
      if (pRVar4 == (REF_DBL *)0x0) {
        pcVar15 = "malloc q of REF_DBL NULL";
        uVar7 = 0x61a;
      }
      else {
        r = (REF_DBL *)malloc(0x48);
        if (r != (REF_DBL *)0x0) {
          pRVar1 = ref_cloud->global;
          RVar14 = *pRVar1;
          m = (int)local_f0;
          local_100 = local_f0 & 0xffffffff;
          uVar11 = 0;
          iVar6 = 0;
          do {
            if (RVar14 != center_global) {
              pRVar5 = ref_cloud->aux;
              lVar9 = uVar11 * local_e0;
              dVar18 = rn[2] * (pRVar5[lVar9 + 2] - local_c8) +
                       *rn * (pRVar5[lVar9] - local_d8) + rn[1] * (pRVar5[lVar9 + 1] - local_d0);
              dVar17 = (pRVar5[lVar9 + 2] - local_c8) * sn[2] +
                       (pRVar5[lVar9] - local_d8) * *sn + (pRVar5[lVar9 + 1] - local_d0) * sn[1];
              local_b8[0] = dVar18 * 0.5 * dVar18;
              local_b8[1] = dVar17 * dVar18;
              local_b8[2] = dVar17 * 0.5 * dVar17;
              pdVar13 = local_f8 + iVar6;
              lVar9 = 0;
              do {
                *pdVar13 = local_b8[lVar9];
                lVar9 = lVar9 + 1;
                pdVar13 = pdVar13 + local_100;
              } while (lVar9 != 3);
              iVar6 = iVar6 + 1;
            }
            uVar11 = uVar11 + 1;
            RVar14 = -1;
            if (uVar11 < uVar16) {
              RVar14 = pRVar1[uVar11];
            }
          } while (uVar11 != uVar16);
          local_104 = uVar2;
          if (m != iVar6) {
            pcVar15 = "A row miscount";
            uVar7 = 0x62e;
LAB_001b3387:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,uVar7,"ref_recon_kexact_rs",pcVar15,local_100,(long)iVar6);
            return 1;
          }
          uVar2 = ref_matrix_qr(m,3,local_f8,pRVar4,r);
          if (uVar2 == 0) {
            pRVar5 = local_98;
            local_48 = 0.0;
            RStack_40 = 0.0;
            local_98[8] = 0.0;
            dStack_50 = 0.0;
            local_98[6] = 0.0;
            local_98[7] = 0.0;
            local_98[4] = 0.0;
            local_98[5] = 0.0;
            local_98[2] = 0.0;
            local_98[3] = 0.0;
            local_98[0] = 0.0;
            local_98[1] = 0.0;
            lVar9 = 0;
            pRVar8 = r;
            do {
              lVar12 = 0;
              do {
                *(double *)((long)pRVar5 + lVar12) =
                     *(double *)((long)pRVar8 + lVar12) + *(double *)((long)pRVar5 + lVar12);
                lVar12 = lVar12 + 0x18;
              } while (lVar12 != 0x48);
              lVar9 = lVar9 + 1;
              pRVar5 = pRVar5 + 1;
              pRVar8 = pRVar8 + 1;
            } while (lVar9 != 3);
            local_104 = 0;
            uVar2 = ref_cloud->n;
            if ((int)uVar2 < 1) {
              iVar6 = 0;
            }
            else {
              RVar14 = *ref_cloud->global;
              iVar6 = 0;
              uVar10 = 0;
              do {
                if (RVar14 != center_global) {
                  dVar17 = ref_cloud->aux[(long)(int)uVar10 * (long)ref_cloud->naux + 3];
                  pdVar13 = pRVar4 + iVar6;
                  lVar9 = 0;
                  do {
                    (&dStack_50)[lVar9] = *pdVar13 * (dVar17 - local_c0) + (&dStack_50)[lVar9];
                    lVar9 = lVar9 + 1;
                    pdVar13 = pdVar13 + m;
                  } while (lVar9 != 3);
                  iVar6 = iVar6 + 1;
                }
                uVar10 = uVar10 + 1;
                RVar14 = -1;
                if ((int)uVar10 < (int)uVar2) {
                  RVar14 = ref_cloud->global[uVar10];
                }
                local_104 = uVar2;
              } while (uVar10 != uVar2);
            }
            if (m == iVar6) {
              RVar3 = ref_matrix_solve_ab(3,4,local_98);
              if (RVar3 != 0) {
                return RVar3;
              }
              local_e8[2] = RStack_40;
              *local_e8 = dStack_50;
              local_e8[1] = local_48;
              free(r);
              free(pRVar4);
              free(local_f8);
              return 0;
            }
            pcVar15 = "b row miscount";
            uVar7 = 0x640;
            goto LAB_001b3387;
          }
          pcVar15 = "kexact lsq hess qr";
          uVar7 = 0x62f;
          goto LAB_001b30bf;
        }
        pcVar15 = "malloc r of REF_DBL NULL";
        uVar7 = 0x61b;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar7,
           "ref_recon_kexact_rs",pcVar15);
    uVar2 = 2;
  }
  else {
    pcVar15 = "missing center";
    uVar7 = 0x60a;
LAB_001b30bf:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar7,
           "ref_recon_kexact_rs",(ulong)uVar2,pcVar15);
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_recon_kexact_rs(REF_GLOB center_global,
                                       REF_CLOUD ref_cloud, REF_DBL *rn,
                                       REF_DBL *sn, REF_DBL *hessian) {
  REF_DBL geom[3], ab[12];
  REF_DBL dxyz[3], dq, dr, ds;
  REF_DBL *a, *q, *r;
  REF_INT m, n;
  REF_GLOB cloud_global;
  REF_INT item, im, i, j;
  REF_DBL xyzs[4];
  REF_BOOL verbose = REF_FALSE;

  RSS(ref_cloud_item(ref_cloud, center_global, &item), "missing center");
  each_ref_cloud_aux(ref_cloud, i) {
    xyzs[i] = ref_cloud_aux(ref_cloud, i, item);
  }
  /* solve A with QR factorization size m x n */
  m = ref_cloud_n(ref_cloud) - 1; /* skip self */
  n = 3;
  if (verbose)
    printf("m %d at %f %f %f %f\n", m, xyzs[0], xyzs[1], xyzs[2], xyzs[3]);
  if (verbose)
    printf("r %f %f %f\ns %f %f %f\n", rn[0], rn[1], rn[2], sn[0], sn[1],
           sn[2]);
  if (m < n) {           /* underdetermined, will end badly */
    return REF_DIV_ZERO; /* signal cloud growth required */
  }
  ref_malloc(a, m * n, REF_DBL);
  ref_malloc(q, m * n, REF_DBL);
  ref_malloc(r, n * n, REF_DBL);
  i = 0;
  each_ref_cloud_global(ref_cloud, item, cloud_global) {
    if (center_global == cloud_global) continue; /* skip self */
    dxyz[0] = ref_cloud_aux(ref_cloud, 0, item) - xyzs[0];
    dxyz[1] = ref_cloud_aux(ref_cloud, 1, item) - xyzs[1];
    dxyz[2] = ref_cloud_aux(ref_cloud, 2, item) - xyzs[2];
    dr = ref_math_dot(dxyz, rn);
    ds = ref_math_dot(dxyz, sn);
    geom[0] = 0.5 * dr * dr;
    geom[1] = dr * ds;
    geom[2] = 0.5 * ds * ds;
    for (j = 0; j < n; j++) {
      a[i + m * j] = geom[j];
      if (verbose) printf(" %12.4e", geom[j]);
    }
    if (verbose) printf(" %f %f %d\n", dr, ds, i);
    i++;
  }
  REIS(m, i, "A row miscount");
  RSS(ref_matrix_qr(m, n, a, q, r), "kexact lsq hess qr");
  if (verbose) RSS(ref_matrix_show_aqr(m, n, a, q, r), "show qr");
  for (i = 0; i < (n + 1) * n; i++) ab[i] = 0.0;
  for (i = 0; i < n; i++) {
    for (j = 0; j < n; j++) {
      ab[i + n * j] += r[i + n * j];
    }
  }
  i = 0;
  each_ref_cloud_global(ref_cloud, item, cloud_global) {
    if (center_global == cloud_global) continue; /* skip self */
    dq = ref_cloud_aux(ref_cloud, 3, item) - xyzs[3];
    for (j = 0; j < n; j++) {
      ab[j + n * n] += q[i + m * j] * dq;
    }
    i++;
  }
  REIS(m, i, "b row miscount");
  if (verbose) RSS(ref_matrix_show_ab(n, n + 1, ab), "show");
  RAISE(ref_matrix_solve_ab(n, n + 1, ab));
  if (verbose) RSS(ref_matrix_show_ab(n, n + 1, ab), "show");
  j = n;
  for (im = 0; im < 3; im++) {
    hessian[im] = ab[im + n * j];
  }
  ref_free(r);
  ref_free(q);
  ref_free(a);

  return REF_SUCCESS;
}